

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::Reflection::Reflection
          (Reflection *this,Descriptor *descriptor,ReflectionSchema *schema,DescriptorPool *pool,
          MessageFactory *factory)

{
  int iVar1;
  DescriptorPool *in_RCX;
  void *in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  undefined8 in_R8;
  DescriptorPool *local_40;
  
  *in_RDI = in_RSI;
  memcpy(in_RDI + 1,in_RDX,0x30);
  local_40 = in_RCX;
  if (in_RCX == (DescriptorPool *)0x0) {
    local_40 = DescriptorPool::internal_generated_pool();
  }
  in_RDI[7] = local_40;
  in_RDI[8] = in_R8;
  *(undefined4 *)(in_RDI + 9) = 0xffffffff;
  iVar1 = Descriptor::field_count((Descriptor *)*in_RDI);
  *(int *)(in_RDI + 9) = iVar1 + -1;
  return;
}

Assistant:

Reflection::Reflection(const Descriptor* descriptor,
                       const internal::ReflectionSchema& schema,
                       const DescriptorPool* pool, MessageFactory* factory)
    : descriptor_(descriptor),
      schema_(schema),
      descriptor_pool_(
          (pool == nullptr) ? DescriptorPool::internal_generated_pool() : pool),
      message_factory_(factory),
      last_non_weak_field_index_(-1) {
  last_non_weak_field_index_ = descriptor_->field_count() - 1;
}